

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

Ifn_Ntk_t * Ifn_NtkParse(char *pStr)

{
  uint uVar1;
  word wVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  Ifn_Ntk_t *p;
  char *pcVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  p = (Ifn_Ntk_t *)calloc(1,0x3730);
  pcVar7 = pStr;
  do {
    if (*pcVar7 == '\0') {
      iVar6 = Ifn_NtkParseInt(pStr,p);
LAB_0043b528:
      if (iVar6 == 0) {
        if (p != (Ifn_Ntk_t *)0x0) {
          free(p);
        }
        p = (Ifn_Ntk_t *)0x0;
      }
      else {
        Ifn_NtkParseConstraints(pStr,p);
        auVar5 = _DAT_0093d220;
        auVar4 = _DAT_0093d210;
        uVar1 = p->nInps;
        if (0 < (long)(int)uVar1) {
          bVar8 = (char)uVar1 - 6;
          uVar9 = 0;
          uVar3 = 1 << (bVar8 & 0x1f);
          if (uVar1 < 7) {
            uVar3 = 1;
          }
          if (uVar1 < 7) {
            bVar8 = 0;
          }
          lVar11 = (ulong)uVar3 - 1;
          auVar14._8_4_ = (int)lVar11;
          auVar14._0_8_ = lVar11;
          auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar14 = auVar14 ^ _DAT_0093d220;
          do {
            lVar11 = (long)((int)uVar9 << (bVar8 & 0x1f));
            iVar6 = auVar14._4_4_;
            iVar15 = auVar14._12_4_;
            if (uVar9 < 6) {
              if (0 < (int)uVar3) {
                wVar2 = s_Truths6[uVar9];
                lVar12 = 0;
                auVar18 = auVar4;
                do {
                  auVar17 = auVar18 ^ auVar5;
                  if ((bool)(~(iVar6 < auVar17._4_4_ ||
                              auVar14._0_4_ < auVar17._0_4_ && auVar17._4_4_ == iVar6) & 1)) {
                    *(word *)((long)p->pTtElems + lVar12 + lVar11 * 8) = wVar2;
                  }
                  if (auVar17._12_4_ <= iVar15 &&
                      (auVar17._8_4_ <= auVar14._8_4_ || auVar17._12_4_ != iVar15)) {
                    *(word *)((long)p->pTtElems + lVar12 + lVar11 * 8 + 8) = wVar2;
                  }
                  lVar16 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 2;
                  auVar18._8_8_ = lVar16 + 2;
                  lVar12 = lVar12 + 0x10;
                } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar12);
              }
            }
            else if (0 < (int)uVar3) {
              uVar10 = 1 << ((char)uVar9 - 6U & 0x1f);
              uVar13 = 0;
              auVar17 = auVar4;
              do {
                auVar18 = auVar17 ^ auVar5;
                if ((bool)(~(iVar6 < auVar18._4_4_ ||
                            auVar14._0_4_ < auVar18._0_4_ && auVar18._4_4_ == iVar6) & 1)) {
                  p->pTtElems[lVar11 + uVar13] = -(ulong)((uVar10 & (uint)uVar13) != 0);
                }
                if (auVar18._12_4_ <= iVar15 &&
                    (auVar18._8_4_ <= auVar14._8_4_ || auVar18._12_4_ != iVar15)) {
                  p->pTtElems[lVar11 + uVar13 + 1] = -(ulong)(((uint)uVar13 + 1 & uVar10) != 0);
                }
                uVar13 = uVar13 + 2;
                lVar12 = auVar17._8_8_;
                auVar17._0_8_ = auVar17._0_8_ + 2;
                auVar17._8_8_ = lVar12 + 2;
              } while ((uVar3 + 1 & 0xfffffffe) != uVar13);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (long)(int)uVar1);
        }
      }
      return p;
    }
    if (*pcVar7 == '=') {
      iVar6 = Ifn_NtkParseInt2(pStr,p);
      goto LAB_0043b528;
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

Ifn_Ntk_t * Ifn_NtkParse( char * pStr )
{
    Ifn_Ntk_t * p = ABC_CALLOC( Ifn_Ntk_t, 1 );
    if ( Ifn_ManStrType2(pStr) )
    {
        if ( !Ifn_NtkParseInt2( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    else
    {
        if ( !Ifn_NtkParseInt( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    Ifn_NtkParseConstraints( pStr, p );
    Abc_TtElemInit2( p->pTtElems, p->nInps );
//    printf( "Finished parsing: " ); Ifn_NtkPrint(p);
    return p;
}